

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O1

void tcg_out_ld(TCGContext_conflict9 *s,TCGType_conflict type,TCGReg ret,TCGReg arg1,intptr_t arg2)

{
  byte *pbVar1;
  tcg_insn_unit *ptVar2;
  TCGReg TVar3;
  int opc;
  uint uVar4;
  ulong uVar5;
  int in_R9D;
  
  switch(type) {
  case TCG_TYPE_I32:
    uVar5 = 0;
    if (0 < (int)arg1) {
      uVar5 = (ulong)arg1;
    }
    TVar3 = (TCGReg)uVar5;
    if (ret < TCG_REG_XMM0) {
      uVar4 = (uint)(uVar5 >> 3) & 1 | ret >> 1 & 4;
      if (uVar4 != 0) {
        pbVar1 = s->code_ptr;
        s->code_ptr = pbVar1 + 1;
        *pbVar1 = (byte)uVar4 | 0x40;
      }
LAB_00d0fe05:
      ptVar2 = s->code_ptr;
      s->code_ptr = ptVar2 + 1;
      *ptVar2 = 0x8b;
      goto LAB_00d0fe54;
    }
    opc = 0x56e;
    break;
  case TCG_TYPE_I64:
    if (ret < TCG_REG_XMM0) {
      TVar3 = TCG_REG_EAX;
      if (0 < (int)arg1) {
        TVar3 = arg1;
      }
      pbVar1 = s->code_ptr;
      s->code_ptr = pbVar1 + 1;
      *pbVar1 = (byte)(TVar3 >> 3) & 1 | (byte)(ret >> 1) & 4 | 0x48;
      goto LAB_00d0fe05;
    }
  case TCG_TYPE_V64:
    TVar3 = TCG_REG_EAX;
    if (0 < (int)arg1) {
      TVar3 = arg1;
    }
    opc = 0x2017e;
    break;
  case TCG_TYPE_V128:
    TVar3 = TCG_REG_EAX;
    if (0 < (int)arg1) {
      TVar3 = arg1;
    }
    opc = 0x56f;
    break;
  case TCG_TYPE_V256:
    TVar3 = TCG_REG_EAX;
    if (0 < (int)arg1) {
      TVar3 = arg1;
    }
    opc = 0xa016f;
    break;
  default:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
               ,0x459,(char *)0x0);
  }
  tcg_out_vex_opc(s,opc,ret,0,TVar3,in_R9D);
LAB_00d0fe54:
  tcg_out_sib_offset(s,ret,arg1,-1,0,arg2);
  return;
}

Assistant:

static void tcg_out_ld(TCGContext *s, TCGType type, TCGReg ret,
                       TCGReg arg1, intptr_t arg2)
{
    switch (type) {
    case TCG_TYPE_I32:
        if (ret < 16) {
            tcg_out_modrm_offset(s, OPC_MOVL_GvEv, ret, arg1, arg2);
        } else {
            tcg_out_vex_modrm_offset(s, OPC_MOVD_VyEy, ret, 0, arg1, arg2);
        }
        break;
    case TCG_TYPE_I64:
        if (ret < 16) {
            tcg_out_modrm_offset(s, OPC_MOVL_GvEv | P_REXW, ret, arg1, arg2);
            break;
        }
        /* FALLTHRU */
    case TCG_TYPE_V64:
        /* There is no instruction that can validate 8-byte alignment.  */
        tcg_debug_assert(ret >= 16);
        tcg_out_vex_modrm_offset(s, OPC_MOVQ_VqWq, ret, 0, arg1, arg2);
        break;
    case TCG_TYPE_V128:
        /*
         * The gvec infrastructure is asserts that v128 vector loads
         * and stores use a 16-byte aligned offset.  Validate that the
         * final pointer is aligned by using an insn that will SIGSEGV.
         */
        tcg_debug_assert(ret >= 16);
        tcg_out_vex_modrm_offset(s, OPC_MOVDQA_VxWx, ret, 0, arg1, arg2);
        break;
    case TCG_TYPE_V256:
        /*
         * The gvec infrastructure only requires 16-byte alignment,
         * so here we must use an unaligned load.
         */
        tcg_debug_assert(ret >= 16);
        tcg_out_vex_modrm_offset(s, OPC_MOVDQU_VxWx | P_VEXL,
                                 ret, 0, arg1, arg2);
        break;
    default:
        g_assert_not_reached();
    }
}